

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetKeyVector2d(ImGuiKey key_left,ImGuiKey key_right,ImGuiKey key_up,ImGuiKey key_down)

{
  float fVar1;
  ImGuiKeyData *pIVar2;
  float fVar3;
  ImGuiKey in_stack_ffffffffffffffe4;
  ImVec2 local_8;
  
  pIVar2 = GetKeyData(in_stack_ffffffffffffffe4);
  fVar3 = pIVar2->AnalogValue;
  pIVar2 = GetKeyData(in_stack_ffffffffffffffe4);
  fVar3 = fVar3 - pIVar2->AnalogValue;
  pIVar2 = GetKeyData((ImGuiKey)fVar3);
  fVar1 = pIVar2->AnalogValue;
  pIVar2 = GetKeyData((ImGuiKey)fVar3);
  ImVec2::ImVec2(&local_8,fVar3,fVar1 - pIVar2->AnalogValue);
  return local_8;
}

Assistant:

ImVec2 ImGui::GetKeyVector2d(ImGuiKey key_left, ImGuiKey key_right, ImGuiKey key_up, ImGuiKey key_down)
{
    return ImVec2(
        GetKeyData(key_right)->AnalogValue - GetKeyData(key_left)->AnalogValue,
        GetKeyData(key_down)->AnalogValue - GetKeyData(key_up)->AnalogValue);
}